

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

void __thiscall Assimp::FILongValueImpl::~FILongValueImpl(FILongValueImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer plVar3;
  
  (this->super_FILongValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008a0340;
  pcVar2 = (this->strValue)._M_dataplus._M_p;
  paVar1 = &(this->strValue).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_FILongValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_008a0398;
  plVar3 = (this->super_FILongValue).value.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar3 != (pointer)0x0) {
    operator_delete(plVar3,(long)(this->super_FILongValue).value.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar3);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

inline FILongValueImpl(std::vector<int64_t> &&value_): strValueValid(false) { value = std::move(value_); }